

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_diagnostic.c
# Opt level: O0

int IoTHubClient_Diagnostic_AddIfNecessary
              (IOTHUB_DIAGNOSTIC_SETTING_DATA *diagSetting,IOTHUB_MESSAGE_HANDLE messageHandle)

{
  _Bool _Var1;
  IOTHUB_MESSAGE_RESULT IVar2;
  IOTHUB_MESSAGE_DIAGNOSTIC_PROPERTY_DATA *diagnosticData_00;
  IOTHUB_MESSAGE_DIAGNOSTIC_PROPERTY_DATA *diagnosticData;
  int result;
  IOTHUB_MESSAGE_HANDLE messageHandle_local;
  IOTHUB_DIAGNOSTIC_SETTING_DATA *diagSetting_local;
  
  if ((diagSetting == (IOTHUB_DIAGNOSTIC_SETTING_DATA *)0x0) ||
     (messageHandle == (IOTHUB_MESSAGE_HANDLE)0x0)) {
    diagnosticData._4_4_ = 0xa1;
  }
  else {
    _Var1 = should_add_diagnostic_info(diagSetting);
    if (_Var1) {
      diagnosticData_00 = prepare_message_diagnostic_data();
      if (diagnosticData_00 == (IOTHUB_MESSAGE_DIAGNOSTIC_PROPERTY_DATA *)0x0) {
        diagnosticData._4_4_ = 0xa9;
      }
      else {
        IVar2 = IoTHubMessage_SetDiagnosticPropertyData(messageHandle,diagnosticData_00);
        if (IVar2 == IOTHUB_MESSAGE_OK) {
          diagnosticData._4_4_ = 0;
        }
        else {
          diagnosticData._4_4_ = 0xaf;
        }
        free(diagnosticData_00->diagnosticCreationTimeUtc);
        free(diagnosticData_00->diagnosticId);
        free(diagnosticData_00);
      }
    }
    else {
      diagnosticData._4_4_ = 0;
    }
  }
  return diagnosticData._4_4_;
}

Assistant:

int IoTHubClient_Diagnostic_AddIfNecessary(IOTHUB_DIAGNOSTIC_SETTING_DATA* diagSetting, IOTHUB_MESSAGE_HANDLE messageHandle)
{
    int result;
    if (diagSetting == NULL || messageHandle == NULL)
    {
        result = MU_FAILURE;
    }
    else if (should_add_diagnostic_info(diagSetting))
    {

        IOTHUB_MESSAGE_DIAGNOSTIC_PROPERTY_DATA* diagnosticData;
        if ((diagnosticData = prepare_message_diagnostic_data()) == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (IoTHubMessage_SetDiagnosticPropertyData(messageHandle, diagnosticData) != IOTHUB_MESSAGE_OK)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            free(diagnosticData->diagnosticCreationTimeUtc);
            free(diagnosticData->diagnosticId);
            free(diagnosticData);
            diagnosticData = NULL;
        }
    }
    else
    {
        result = 0;
    }

    return result;
}